

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O1

void __thiscall Assimp::OptimizeMeshesProcess::Execute(OptimizeMeshesProcess *this,aiScene *pScene)

{
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
  *this_01;
  pointer *pppaVar1;
  pointer pMVar2;
  iterator __position;
  pointer ppaVar3;
  pointer ppaVar4;
  uint uVar5;
  Logger *this_02;
  runtime_error *this_03;
  aiMesh **__args;
  size_t __n;
  long lVar6;
  char *message;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int local_1dc;
  char *local_1c8;
  char local_1b8 [16];
  undefined1 local_1a8 [376];
  
  uVar8 = (ulong)pScene->mNumMeshes;
  this_02 = DefaultLogger::get();
  if (uVar8 < 2) {
    message = "Skipping OptimizeMeshesProcess";
  }
  else {
    Logger::debug(this_02,"OptimizeMeshesProcess begin");
    this->mScene = pScene;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(&this->merge_list,0);
    this_00 = &this->output;
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(this_00,0);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
              (&this->merge_list,(ulong)pScene->mNumMeshes);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(this_00,(ulong)pScene->mNumMeshes);
    this_01 = &this->meshes;
    std::
    vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
    ::resize(this_01,(ulong)pScene->mNumMeshes);
    FindInstancedMeshes(this,pScene->mRootNode);
    if (this->max_verts == 0xdeadbeef) {
      this->max_verts = 0xffffffff;
    }
    if (pScene->mNumMeshes != 0) {
      lVar6 = 0;
      lVar9 = 0;
      uVar7 = 0;
      local_1dc = 0;
      do {
        uVar5 = GetMeshVFormatUnique(*(aiMesh **)((long)pScene->mMeshes + lVar9));
        *(uint *)((long)&((this_01->
                          super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                          )._M_impl.super__Vector_impl_data._M_start)->vertex_format + lVar6) =
             uVar5;
        pMVar2 = (this_01->
                 super__Vector_base<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((1 < *(uint *)((long)&pMVar2->instance_cnt + lVar6)) &&
           (*(int *)((long)&pMVar2->output_id + lVar6) == -1)) {
          *(int *)((long)&pMVar2->output_id + lVar6) = local_1dc;
          local_1dc = local_1dc + 1;
          __position._M_current =
               (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          __args = (aiMesh **)((long)this->mScene->mMeshes + lVar9);
          if (__position._M_current ==
              (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            pppaVar1 = &(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppaVar1 = *pppaVar1 + 1;
          }
        }
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 8;
        lVar6 = lVar6 + 0xc;
      } while (uVar7 < pScene->mNumMeshes);
    }
    ProcessNode(this,pScene->mRootNode);
    if ((this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "OptimizeMeshes: No meshes remaining; there\'s definitely something wrong","");
      std::runtime_error::runtime_error(this_03,(string *)local_1a8);
      *(undefined ***)this_03 = &PTR__runtime_error_0081d260;
      __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
    ::resize(this_01,0);
    uVar7 = (long)(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar8 < uVar7) {
      __assert_fail("output.size() <= num_old",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/OptimizeMeshes.cpp"
                    ,0x94,"virtual void Assimp::OptimizeMeshesProcess::Execute(aiScene *)");
    }
    this->mScene->mNumMeshes = (uint)uVar7;
    ppaVar3 = (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __n = (long)(this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppaVar3;
    if (__n != 0) {
      memmove(this->mScene->mMeshes,ppaVar3,__n);
    }
    ppaVar3 = (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppaVar4 = (this->output).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    this_02 = DefaultLogger::get();
    if ((long)ppaVar3 - (long)ppaVar4 >> 3 != uVar8) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[47]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [47])"OptimizeMeshesProcess finished. Input meshes: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,", Output meshes: ",0x11);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      Logger::debug(this_02,local_1c8);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      return;
    }
    message = "OptimizeMeshesProcess finished";
  }
  Logger::debug(this_02,message);
  return;
}

Assistant:

void OptimizeMeshesProcess::Execute( aiScene* pScene)
{
    const unsigned int num_old = pScene->mNumMeshes;
    if (num_old <= 1) {
        ASSIMP_LOG_DEBUG("Skipping OptimizeMeshesProcess");
        return;
    }

    ASSIMP_LOG_DEBUG("OptimizeMeshesProcess begin");
    mScene = pScene;

    // need to clear persistent members from previous runs
    merge_list.resize( 0 );
    output.resize( 0 );

    // ensure we have the right sizes
    merge_list.reserve(pScene->mNumMeshes);
    output.reserve(pScene->mNumMeshes);

    // Prepare lookup tables
    meshes.resize(pScene->mNumMeshes);
    FindInstancedMeshes(pScene->mRootNode);
    if( max_verts == DeadBeef ) /* undo the magic hack */
        max_verts = NotSet;

    // ... instanced meshes are immediately processed and added to the output list
    for (unsigned int i = 0, n = 0; i < pScene->mNumMeshes;++i) {
        meshes[i].vertex_format = GetMeshVFormatUnique(pScene->mMeshes[i]);

        if (meshes[i].instance_cnt > 1 && meshes[i].output_id == NotSet ) {
            meshes[i].output_id = n++;
            output.push_back(mScene->mMeshes[i]);
        }
    }

    // and process all nodes in the scenegraph recursively
    ProcessNode(pScene->mRootNode);
    if (!output.size()) {
        throw DeadlyImportError("OptimizeMeshes: No meshes remaining; there's definitely something wrong");
    }

    meshes.resize( 0 );
    ai_assert(output.size() <= num_old);

    mScene->mNumMeshes = static_cast<unsigned int>(output.size());
    std::copy(output.begin(),output.end(),mScene->mMeshes);

    if (output.size() != num_old) {
        ASSIMP_LOG_DEBUG_F("OptimizeMeshesProcess finished. Input meshes: ", num_old, ", Output meshes: ", pScene->mNumMeshes);
    } else {
        ASSIMP_LOG_DEBUG( "OptimizeMeshesProcess finished" );
    }
}